

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_server.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int *piVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  string_view key;
  string_view value;
  io_service service;
  MiniBusClient client;
  io_context iStack_1568;
  shared_ptr<mini_bus::ConnectionInfo> local_1558;
  address local_1548;
  undefined1 local_1528 [48];
  _Any_data local_14f8;
  code *local_14e8;
  code *local_14e0;
  
  boost::asio::io_context::io_context(&iStack_1568);
  boost::asio::ip::make_address(&local_1548,"127.0.0.1");
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<boost::asio::ip::tcp> *)(local_1528 + 0x14),&local_1548,0xfc8);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011b7d0;
  local_14f8._M_unused._M_object = (void *)0x0;
  local_14f8._8_8_ = 0;
  local_14e0 = std::
               _Function_handler<void_(mini_bus::MiniBusClient_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/codehz[P]mini_bus_cpp/src/demo_server.cpp:46:86)>
               ::_M_invoke;
  local_14e8 = std::
               _Function_handler<void_(mini_bus::MiniBusClient_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/codehz[P]mini_bus_cpp/src/demo_server.cpp:46:86)>
               ::_M_manager;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__AutoReconnectConnection_0011b970;
  *(io_context **)&p_Var2[1]._M_use_count = &iStack_1568;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)local_1528._20_8_;
  p_Var2[2]._M_use_count = local_1528._28_4_;
  p_Var2[2]._M_weak_count = local_1528._32_4_;
  *(ulong *)&p_Var2[2]._M_weak_count = CONCAT44(local_1528._36_4_,local_1528._32_4_);
  *(undefined8 *)((long)&p_Var2[3]._vptr__Sp_counted_base + 4) = local_1528._40_8_;
  p_Var2[4]._vptr__Sp_counted_base = (_func_int **)0x5;
  std::function<void_(mini_bus::MiniBusClient_&)>::function
            ((function<void_(mini_bus::MiniBusClient_&)> *)&p_Var2[4]._M_use_count,
             (function<void_(mini_bus::MiniBusClient_&)> *)&local_14f8);
  if (local_14e8 != (code *)0x0) {
    (*local_14e8)(&local_14f8,&local_14f8,3);
  }
  local_1558.super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  local_1558.super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  mini_bus::MiniBusClient::MiniBusClient((MiniBusClient *)&local_14f8,&local_1558);
  if (local_1558.super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1558.super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  do {
    local_1548.type_ = ipv6;
    local_1548.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    local_1548.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    do {
      iVar1 = nanosleep((timespec *)&local_1548,(timespec *)&local_1548);
      if (iVar1 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    key._M_str = (char *)0x5;
    key._M_len = (size_t)&local_14f8;
    value._M_str = (char *)0x6;
    value._M_len = (size_t)"event";
    mini_bus::MiniBusClient::notify((MiniBusClient *)local_1528,key,value);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1528._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1528._8_8_);
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
  using namespace std::chrono_literals;
  try {
    io_service service;
    MiniBusClient client{std::make_shared<AutoReconnectConnection>(
        service, ip::tcp::endpoint{ip::address::from_string("127.0.0.1"), 4040}, 5s, [](MiniBusClient &client) {
          client.register_handler("echo", [](auto inp) { return std::string{inp}; });
          client.set("registry", "demo", "(value will be ignored)")->wait();
          client.set_private("key", "value")->wait();
        })};
    while (true) {
      std::this_thread::sleep_for(1s);
      try {
        client.notify("event", "notify");
      } catch (...) {
        std::cout << "failed to send notify" << std::endl;
      }
    }
  } catch (std::exception &e) { std::cout << e.what() << std::endl; }
}